

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-gvec.c
# Opt level: O0

void expand_2sh_vec(TCGContext_conflict9 *tcg_ctx,uint vece,uint32_t dofs,uint32_t aofs,
                   uint32_t oprsz,uint32_t tysz,TCGType_conflict type,TCGv_i32 shift,
                   _func_void_TCGContext_ptr_uint_TCGv_vec_TCGv_vec_TCGv_i32_conflict9 *fni)

{
  TCGv_vec arg;
  uint local_34;
  uint32_t i;
  TCGv_vec t0;
  uint32_t tysz_local;
  uint32_t oprsz_local;
  uint32_t aofs_local;
  uint32_t dofs_local;
  uint vece_local;
  TCGContext_conflict9 *tcg_ctx_local;
  
  arg = tcg_temp_new_vec_tricore(tcg_ctx,type);
  for (local_34 = 0; local_34 < oprsz; local_34 = tysz + local_34) {
    tcg_gen_ld_vec_tricore(tcg_ctx,arg,tcg_ctx->cpu_env,(ulong)(aofs + local_34));
    (*fni)(tcg_ctx,vece,arg,arg,shift);
    tcg_gen_st_vec_tricore(tcg_ctx,arg,tcg_ctx->cpu_env,(ulong)(dofs + local_34));
  }
  tcg_temp_free_vec(tcg_ctx,arg);
  return;
}

Assistant:

static void expand_2sh_vec(TCGContext *tcg_ctx, unsigned vece, uint32_t dofs, uint32_t aofs,
                           uint32_t oprsz, uint32_t tysz, TCGType type,
                           TCGv_i32 shift,
                           void (*fni)(TCGContext *, unsigned, TCGv_vec, TCGv_vec, TCGv_i32))
{
    TCGv_vec t0 = tcg_temp_new_vec(tcg_ctx, type);
    uint32_t i;

    for (i = 0; i < oprsz; i += tysz) {
        tcg_gen_ld_vec(tcg_ctx, t0, tcg_ctx->cpu_env, aofs + i);
        fni(tcg_ctx, vece, t0, t0, shift);
        tcg_gen_st_vec(tcg_ctx, t0, tcg_ctx->cpu_env, dofs + i);
    }
    tcg_temp_free_vec(tcg_ctx, t0);
}